

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_info.cpp
# Opt level: O0

uint32_t __thiscall license::os::CpuInfo::model(CpuInfo *this)

{
  uint local_24 [2];
  uint32_t edx;
  uint32_t ecx;
  uint32_t ebx;
  uint32_t eax;
  uint32_t level;
  CpuInfo *this_local;
  
  ebx = 1;
  ecx = 0;
  edx = 0;
  local_24[1] = 0;
  local_24[0] = 0;
  _eax = this;
  __get_cpuid(1,&ecx,&edx,local_24 + 1,local_24);
  return ecx & 0x3fff | (ecx & 0x3ff8000) >> 2 | edx << 0x18;
}

Assistant:

uint32_t CpuInfo::model() const {
	uint32_t level = 1, eax = 0, ebx = 0, ecx = 0, edx = 0;
	__get_cpuid(level, &eax, &ebx, &ecx, &edx);
	// ax bits 0-3 stepping,4-7 model,8-11 family id,12-13 processor type
	//        14-15 reserved, 16-19 extended model, 20-27 extended family, 27-31 reserved
	// bx bits 0-7 brand index
	return (eax & 0x3FFF) | (eax & 0x3FF8000) >> 2 | (ebx & 0xff) << 24;
}